

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O2

void stbir__vertical_gather_with_6_coeffs_cont
               (float *outputp,float *vertical_coefficients,float **inputs,float *input0_end)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  long lVar105;
  long lVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  
  pfVar9 = *inputs;
  pfVar10 = inputs[1];
  fVar111 = (float)*(undefined8 *)vertical_coefficients;
  fVar112 = (float)((ulong)*(undefined8 *)vertical_coefficients >> 0x20);
  pfVar11 = inputs[2];
  pfVar12 = inputs[3];
  pfVar13 = inputs[4];
  pfVar14 = inputs[5];
  fVar107 = (float)*(undefined8 *)(vertical_coefficients + 2);
  fVar108 = (float)((ulong)*(undefined8 *)(vertical_coefficients + 2) >> 0x20);
  fVar109 = (float)*(undefined8 *)(vertical_coefficients + 4);
  fVar110 = (float)((ulong)*(undefined8 *)(vertical_coefficients + 4) >> 0x20);
  lVar106 = 0;
  for (lVar105 = (long)input0_end - (long)pfVar9; 0x3f < lVar105; lVar105 = lVar105 + -0x40) {
    pfVar1 = (float *)((long)outputp + lVar106);
    pfVar2 = (float *)((long)pfVar9 + lVar106);
    fVar15 = pfVar2[1];
    fVar16 = pfVar2[2];
    fVar17 = pfVar2[3];
    pfVar3 = (float *)((long)pfVar9 + lVar106 + 0x10);
    fVar18 = *pfVar3;
    fVar19 = pfVar3[1];
    fVar20 = pfVar3[2];
    fVar21 = pfVar3[3];
    pfVar3 = (float *)((long)pfVar9 + lVar106 + 0x20);
    fVar22 = *pfVar3;
    fVar23 = pfVar3[1];
    fVar24 = pfVar3[2];
    fVar25 = pfVar3[3];
    pfVar3 = (float *)((long)pfVar9 + lVar106 + 0x30);
    fVar26 = *pfVar3;
    fVar27 = pfVar3[1];
    fVar28 = pfVar3[2];
    fVar29 = pfVar3[3];
    pfVar3 = (float *)((long)pfVar10 + lVar106);
    fVar30 = pfVar3[1];
    fVar31 = pfVar3[2];
    fVar32 = pfVar3[3];
    pfVar4 = (float *)((long)pfVar10 + lVar106 + 0x10);
    fVar33 = *pfVar4;
    fVar34 = pfVar4[1];
    fVar35 = pfVar4[2];
    fVar36 = pfVar4[3];
    pfVar4 = (float *)((long)pfVar10 + lVar106 + 0x20);
    fVar37 = *pfVar4;
    fVar38 = pfVar4[1];
    fVar39 = pfVar4[2];
    fVar40 = pfVar4[3];
    pfVar4 = (float *)((long)pfVar10 + lVar106 + 0x30);
    fVar41 = *pfVar4;
    fVar42 = pfVar4[1];
    fVar43 = pfVar4[2];
    fVar44 = pfVar4[3];
    pfVar4 = (float *)((long)pfVar11 + lVar106);
    fVar45 = pfVar4[1];
    fVar46 = pfVar4[2];
    fVar47 = pfVar4[3];
    pfVar5 = (float *)((long)pfVar11 + lVar106 + 0x10);
    fVar48 = *pfVar5;
    fVar49 = pfVar5[1];
    fVar50 = pfVar5[2];
    fVar51 = pfVar5[3];
    pfVar5 = (float *)((long)pfVar11 + lVar106 + 0x20);
    fVar52 = *pfVar5;
    fVar53 = pfVar5[1];
    fVar54 = pfVar5[2];
    fVar55 = pfVar5[3];
    pfVar5 = (float *)((long)pfVar11 + lVar106 + 0x30);
    fVar56 = *pfVar5;
    fVar57 = pfVar5[1];
    fVar58 = pfVar5[2];
    fVar59 = pfVar5[3];
    pfVar5 = (float *)((long)pfVar12 + lVar106);
    fVar60 = pfVar5[1];
    fVar61 = pfVar5[2];
    fVar62 = pfVar5[3];
    pfVar6 = (float *)((long)pfVar12 + lVar106 + 0x10);
    fVar63 = *pfVar6;
    fVar64 = pfVar6[1];
    fVar65 = pfVar6[2];
    fVar66 = pfVar6[3];
    pfVar6 = (float *)((long)pfVar12 + lVar106 + 0x20);
    fVar67 = *pfVar6;
    fVar68 = pfVar6[1];
    fVar69 = pfVar6[2];
    fVar70 = pfVar6[3];
    pfVar6 = (float *)((long)pfVar12 + lVar106 + 0x30);
    fVar71 = *pfVar6;
    fVar72 = pfVar6[1];
    fVar73 = pfVar6[2];
    fVar74 = pfVar6[3];
    pfVar6 = (float *)((long)pfVar13 + lVar106);
    fVar75 = pfVar6[1];
    fVar76 = pfVar6[2];
    fVar77 = pfVar6[3];
    pfVar7 = (float *)((long)pfVar13 + lVar106 + 0x10);
    fVar78 = *pfVar7;
    fVar79 = pfVar7[1];
    fVar80 = pfVar7[2];
    fVar81 = pfVar7[3];
    pfVar7 = (float *)((long)pfVar13 + lVar106 + 0x20);
    fVar82 = *pfVar7;
    fVar83 = pfVar7[1];
    fVar84 = pfVar7[2];
    fVar85 = pfVar7[3];
    pfVar7 = (float *)((long)pfVar13 + lVar106 + 0x30);
    fVar86 = *pfVar7;
    fVar87 = pfVar7[1];
    fVar88 = pfVar7[2];
    fVar89 = pfVar7[3];
    pfVar7 = (float *)((long)pfVar14 + lVar106);
    fVar90 = pfVar7[1];
    fVar91 = pfVar7[2];
    fVar92 = pfVar7[3];
    pfVar8 = (float *)((long)pfVar14 + lVar106 + 0x10);
    fVar93 = *pfVar8;
    fVar94 = pfVar8[1];
    fVar95 = pfVar8[2];
    fVar96 = pfVar8[3];
    pfVar8 = (float *)((long)pfVar14 + lVar106 + 0x20);
    fVar97 = *pfVar8;
    fVar98 = pfVar8[1];
    fVar99 = pfVar8[2];
    fVar100 = pfVar8[3];
    pfVar8 = (float *)((long)pfVar14 + lVar106 + 0x30);
    fVar101 = *pfVar8;
    fVar102 = pfVar8[1];
    fVar103 = pfVar8[2];
    fVar104 = pfVar8[3];
    *pfVar1 = *pfVar7 * fVar110 +
              *pfVar6 * fVar109 +
              *pfVar5 * fVar108 +
              *pfVar4 * fVar107 + *pfVar3 * fVar112 + *pfVar2 * fVar111 + *pfVar1;
    pfVar1[1] = fVar90 * fVar110 +
                fVar75 * fVar109 +
                fVar60 * fVar108 +
                fVar45 * fVar107 + fVar30 * fVar112 + fVar15 * fVar111 + pfVar1[1];
    pfVar1[2] = fVar91 * fVar110 +
                fVar76 * fVar109 +
                fVar61 * fVar108 +
                fVar46 * fVar107 + fVar31 * fVar112 + fVar16 * fVar111 + pfVar1[2];
    pfVar1[3] = fVar92 * fVar110 +
                fVar77 * fVar109 +
                fVar62 * fVar108 +
                fVar47 * fVar107 + fVar32 * fVar112 + fVar17 * fVar111 + pfVar1[3];
    pfVar1[4] = fVar93 * fVar110 +
                fVar78 * fVar109 +
                fVar63 * fVar108 +
                fVar48 * fVar107 + fVar33 * fVar112 + fVar18 * fVar111 + pfVar1[4];
    pfVar1[5] = fVar94 * fVar110 +
                fVar79 * fVar109 +
                fVar64 * fVar108 +
                fVar49 * fVar107 + fVar34 * fVar112 + fVar19 * fVar111 + pfVar1[5];
    pfVar1[6] = fVar95 * fVar110 +
                fVar80 * fVar109 +
                fVar65 * fVar108 +
                fVar50 * fVar107 + fVar35 * fVar112 + fVar20 * fVar111 + pfVar1[6];
    pfVar1[7] = fVar96 * fVar110 +
                fVar81 * fVar109 +
                fVar66 * fVar108 +
                fVar51 * fVar107 + fVar36 * fVar112 + fVar21 * fVar111 + pfVar1[7];
    pfVar1[8] = fVar97 * fVar110 +
                fVar82 * fVar109 +
                fVar67 * fVar108 +
                fVar52 * fVar107 + fVar37 * fVar112 + fVar22 * fVar111 + pfVar1[8];
    pfVar1[9] = fVar98 * fVar110 +
                fVar83 * fVar109 +
                fVar68 * fVar108 +
                fVar53 * fVar107 + fVar38 * fVar112 + fVar23 * fVar111 + pfVar1[9];
    pfVar1[10] = fVar99 * fVar110 +
                 fVar84 * fVar109 +
                 fVar69 * fVar108 +
                 fVar54 * fVar107 + fVar39 * fVar112 + fVar24 * fVar111 + pfVar1[10];
    pfVar1[0xb] = fVar100 * fVar110 +
                  fVar85 * fVar109 +
                  fVar70 * fVar108 +
                  fVar55 * fVar107 + fVar40 * fVar112 + fVar25 * fVar111 + pfVar1[0xb];
    pfVar1[0xc] = fVar101 * fVar110 +
                  fVar86 * fVar109 +
                  fVar71 * fVar108 +
                  fVar56 * fVar107 + fVar41 * fVar112 + fVar26 * fVar111 + pfVar1[0xc];
    pfVar1[0xd] = fVar102 * fVar110 +
                  fVar87 * fVar109 +
                  fVar72 * fVar108 +
                  fVar57 * fVar107 + fVar42 * fVar112 + fVar27 * fVar111 + pfVar1[0xd];
    pfVar1[0xe] = fVar103 * fVar110 +
                  fVar88 * fVar109 +
                  fVar73 * fVar108 +
                  fVar58 * fVar107 + fVar43 * fVar112 + fVar28 * fVar111 + pfVar1[0xe];
    pfVar1[0xf] = fVar104 * fVar110 +
                  fVar89 * fVar109 +
                  fVar74 * fVar108 +
                  fVar59 * fVar107 + fVar44 * fVar112 + fVar29 * fVar111 + pfVar1[0xf];
    lVar106 = lVar106 + 0x40;
  }
  for (; pfVar1 = (float *)((long)outputp + lVar106), 0xf < lVar105; lVar105 = lVar105 + -0x10) {
    pfVar2 = (float *)((long)pfVar9 + lVar106);
    fVar15 = pfVar2[1];
    fVar16 = pfVar2[2];
    fVar17 = pfVar2[3];
    pfVar3 = (float *)((long)pfVar10 + lVar106);
    fVar18 = pfVar3[1];
    fVar19 = pfVar3[2];
    fVar20 = pfVar3[3];
    pfVar4 = (float *)((long)pfVar11 + lVar106);
    fVar21 = pfVar4[1];
    fVar22 = pfVar4[2];
    fVar23 = pfVar4[3];
    pfVar5 = (float *)((long)pfVar12 + lVar106);
    fVar24 = pfVar5[1];
    fVar25 = pfVar5[2];
    fVar26 = pfVar5[3];
    pfVar6 = (float *)((long)pfVar13 + lVar106);
    fVar27 = pfVar6[1];
    fVar28 = pfVar6[2];
    fVar29 = pfVar6[3];
    pfVar7 = (float *)((long)pfVar14 + lVar106);
    fVar30 = pfVar7[1];
    fVar31 = pfVar7[2];
    fVar32 = pfVar7[3];
    *pfVar1 = *pfVar7 * fVar110 +
              *pfVar6 * fVar109 +
              *pfVar5 * fVar108 +
              *pfVar4 * fVar107 + *pfVar3 * fVar112 + *pfVar2 * fVar111 + *pfVar1;
    pfVar1[1] = fVar30 * fVar110 +
                fVar27 * fVar109 +
                fVar24 * fVar108 +
                fVar21 * fVar107 + fVar18 * fVar112 + fVar15 * fVar111 + pfVar1[1];
    pfVar1[2] = fVar31 * fVar110 +
                fVar28 * fVar109 +
                fVar25 * fVar108 +
                fVar22 * fVar107 + fVar19 * fVar112 + fVar16 * fVar111 + pfVar1[2];
    pfVar1[3] = fVar32 * fVar110 +
                fVar29 * fVar109 +
                fVar26 * fVar108 +
                fVar23 * fVar107 + fVar20 * fVar112 + fVar17 * fVar111 + pfVar1[3];
    lVar106 = lVar106 + 0x10;
  }
  for (lVar105 = 0; (float *)((long)pfVar9 + lVar105 + lVar106) < input0_end; lVar105 = lVar105 + 4)
  {
    *(float *)((long)outputp + lVar106 + lVar105) =
         *(float *)((long)pfVar14 + lVar106 + lVar105) * fVar110 +
         *(float *)((long)pfVar12 + lVar106 + lVar105) * fVar108 +
         *(float *)((long)pfVar10 + lVar106 + lVar105) * fVar112 +
         *(float *)((long)outputp + lVar106 + lVar105) +
         *(float *)((long)pfVar9 + lVar106 + lVar105) * fVar111 +
         *(float *)((long)pfVar11 + lVar106 + lVar105) * fVar107 +
         *(float *)((long)pfVar13 + lVar106 + lVar105) * fVar109;
  }
  return;
}

Assistant:

static void STBIR_chans( stbir__vertical_gather_with_,_coeffs)( float * outputp, float const * vertical_coefficients, float const ** inputs, float const * input0_end )
{
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = outputp;

  stbIF0( float const * input0 = inputs[0]; float c0s = vertical_coefficients[0]; )
  stbIF1( float const * input1 = inputs[1]; float c1s = vertical_coefficients[1]; )
  stbIF2( float const * input2 = inputs[2]; float c2s = vertical_coefficients[2]; )
  stbIF3( float const * input3 = inputs[3]; float c3s = vertical_coefficients[3]; )
  stbIF4( float const * input4 = inputs[4]; float c4s = vertical_coefficients[4]; )
  stbIF5( float const * input5 = inputs[5]; float c5s = vertical_coefficients[5]; )
  stbIF6( float const * input6 = inputs[6]; float c6s = vertical_coefficients[6]; )
  stbIF7( float const * input7 = inputs[7]; float c7s = vertical_coefficients[7]; )

#if ( STBIR__vertical_channels == 1 ) && !defined(STB_IMAGE_RESIZE_VERTICAL_CONTINUE)
  // check single channel one weight
  if ( ( c0s >= (1.0f-0.000001f) ) && ( c0s <= (1.0f+0.000001f) ) )
  {
    STBIR_MEMCPY( output, input0, (char*)input0_end - (char*)input0 );
    return;
  }
#endif

  #ifdef STBIR_SIMD
  {
    stbIF0(stbir__simdfX c0 = stbir__simdf_frepX( c0s ); )
    stbIF1(stbir__simdfX c1 = stbir__simdf_frepX( c1s ); )
    stbIF2(stbir__simdfX c2 = stbir__simdf_frepX( c2s ); )
    stbIF3(stbir__simdfX c3 = stbir__simdf_frepX( c3s ); )
    stbIF4(stbir__simdfX c4 = stbir__simdf_frepX( c4s ); )
    stbIF5(stbir__simdfX c5 = stbir__simdf_frepX( c5s ); )
    stbIF6(stbir__simdfX c6 = stbir__simdf_frepX( c6s ); )
    stbIF7(stbir__simdfX c7 = stbir__simdf_frepX( c7s ); )

    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input0_end - (char*) input0 ) >= (16*stbir__simdfX_float_count) )
    {
      stbir__simdfX o0, o1, o2, o3, r0, r1, r2, r3;
      STBIR_SIMD_NO_UNROLL(output);

      // prefetch four loop iterations ahead (doesn't affect much for small resizes, but helps with big ones)
      stbIF0( stbir__prefetch( input0 + (16*stbir__simdfX_float_count) ); )
      stbIF1( stbir__prefetch( input1 + (16*stbir__simdfX_float_count) ); )
      stbIF2( stbir__prefetch( input2 + (16*stbir__simdfX_float_count) ); )
      stbIF3( stbir__prefetch( input3 + (16*stbir__simdfX_float_count) ); )
      stbIF4( stbir__prefetch( input4 + (16*stbir__simdfX_float_count) ); )
      stbIF5( stbir__prefetch( input5 + (16*stbir__simdfX_float_count) ); )
      stbIF6( stbir__prefetch( input6 + (16*stbir__simdfX_float_count) ); )
      stbIF7( stbir__prefetch( input7 + (16*stbir__simdfX_float_count) ); )

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdfX_load( o0, output );      stbir__simdfX_load( o1, output+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( o3, output+(3*stbir__simdfX_float_count) );
              stbir__simdfX_load( r0, input0 );      stbir__simdfX_load( r1, input0+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input0+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input0+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c0 );  stbir__simdfX_madd( o1, o1, r1, c0 );                         stbir__simdfX_madd( o2, o2, r2, c0 );                             stbir__simdfX_madd( o3, o3, r3, c0 ); )
      #else
      stbIF0( stbir__simdfX_load( r0, input0 );      stbir__simdfX_load( r1, input0+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input0+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input0+(3*stbir__simdfX_float_count) );
              stbir__simdfX_mult( o0, r0, c0 );      stbir__simdfX_mult( o1, r1, c0 );                             stbir__simdfX_mult( o2, r2, c0 );                                 stbir__simdfX_mult( o3, r3, c0 );  )
      #endif

      stbIF1( stbir__simdfX_load( r0, input1 );      stbir__simdfX_load( r1, input1+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input1+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input1+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c1 );  stbir__simdfX_madd( o1, o1, r1, c1 );                         stbir__simdfX_madd( o2, o2, r2, c1 );                             stbir__simdfX_madd( o3, o3, r3, c1 ); )
      stbIF2( stbir__simdfX_load( r0, input2 );      stbir__simdfX_load( r1, input2+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input2+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input2+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c2 );  stbir__simdfX_madd( o1, o1, r1, c2 );                         stbir__simdfX_madd( o2, o2, r2, c2 );                             stbir__simdfX_madd( o3, o3, r3, c2 ); )
      stbIF3( stbir__simdfX_load( r0, input3 );      stbir__simdfX_load( r1, input3+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input3+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input3+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c3 );  stbir__simdfX_madd( o1, o1, r1, c3 );                         stbir__simdfX_madd( o2, o2, r2, c3 );                             stbir__simdfX_madd( o3, o3, r3, c3 ); )
      stbIF4( stbir__simdfX_load( r0, input4 );      stbir__simdfX_load( r1, input4+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input4+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input4+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c4 );  stbir__simdfX_madd( o1, o1, r1, c4 );                         stbir__simdfX_madd( o2, o2, r2, c4 );                             stbir__simdfX_madd( o3, o3, r3, c4 ); )
      stbIF5( stbir__simdfX_load( r0, input5 );      stbir__simdfX_load( r1, input5+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input5+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input5+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c5 );  stbir__simdfX_madd( o1, o1, r1, c5 );                         stbir__simdfX_madd( o2, o2, r2, c5 );                             stbir__simdfX_madd( o3, o3, r3, c5 ); )
      stbIF6( stbir__simdfX_load( r0, input6 );      stbir__simdfX_load( r1, input6+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input6+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input6+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c6 );  stbir__simdfX_madd( o1, o1, r1, c6 );                         stbir__simdfX_madd( o2, o2, r2, c6 );                             stbir__simdfX_madd( o3, o3, r3, c6 ); )
      stbIF7( stbir__simdfX_load( r0, input7 );      stbir__simdfX_load( r1, input7+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input7+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input7+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c7 );  stbir__simdfX_madd( o1, o1, r1, c7 );                         stbir__simdfX_madd( o2, o2, r2, c7 );                             stbir__simdfX_madd( o3, o3, r3, c7 ); )

      stbir__simdfX_store( output, o0 );             stbir__simdfX_store( output+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output+(2*stbir__simdfX_float_count), o2 );  stbir__simdfX_store( output+(3*stbir__simdfX_float_count), o3 );
      output += (4*stbir__simdfX_float_count);
      stbIF0( input0 += (4*stbir__simdfX_float_count); ) stbIF1( input1 += (4*stbir__simdfX_float_count); ) stbIF2( input2 += (4*stbir__simdfX_float_count); ) stbIF3( input3 += (4*stbir__simdfX_float_count); ) stbIF4( input4 += (4*stbir__simdfX_float_count); ) stbIF5( input5 += (4*stbir__simdfX_float_count); ) stbIF6( input6 += (4*stbir__simdfX_float_count); ) stbIF7( input7 += (4*stbir__simdfX_float_count); )
    }

    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input0_end - (char*) input0 ) >= 16 )
    {
      stbir__simdf o0, r0;
      STBIR_SIMD_NO_UNROLL(output);

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdf_load( o0, output );   stbir__simdf_load( r0, input0 ); stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) ); )
      #else
      stbIF0( stbir__simdf_load( r0, input0 );  stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) ); )
      #endif
      stbIF1( stbir__simdf_load( r0, input1 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c1 ) ); )
      stbIF2( stbir__simdf_load( r0, input2 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c2 ) ); )
      stbIF3( stbir__simdf_load( r0, input3 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c3 ) ); )
      stbIF4( stbir__simdf_load( r0, input4 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c4 ) ); )
      stbIF5( stbir__simdf_load( r0, input5 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c5 ) ); )
      stbIF6( stbir__simdf_load( r0, input6 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c6 ) ); )
      stbIF7( stbir__simdf_load( r0, input7 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c7 ) ); )

      stbir__simdf_store( output, o0 );
      output += 4;
      stbIF0( input0 += 4; ) stbIF1( input1 += 4; ) stbIF2( input2 += 4; ) stbIF3( input3 += 4; ) stbIF4( input4 += 4; ) stbIF5( input5 += 4; ) stbIF6( input6 += 4; ) stbIF7( input7 += 4; )
    }
  }
  #else
  STBIR_NO_UNROLL_LOOP_START
  while ( ( (char*)input0_end - (char*) input0 ) >= 16 )
  {
    float o0, o1, o2, o3;
    STBIR_NO_UNROLL(output);
    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( o0 = output[0] + input0[0] * c0s; o1 = output[1] + input0[1] * c0s; o2 = output[2] + input0[2] * c0s; o3 = output[3] + input0[3] * c0s; )
    #else
    stbIF0( o0  = input0[0] * c0s; o1  = input0[1] * c0s; o2  = input0[2] * c0s; o3  = input0[3] * c0s; )
    #endif
    stbIF1( o0 += input1[0] * c1s; o1 += input1[1] * c1s; o2 += input1[2] * c1s; o3 += input1[3] * c1s; )
    stbIF2( o0 += input2[0] * c2s; o1 += input2[1] * c2s; o2 += input2[2] * c2s; o3 += input2[3] * c2s; )
    stbIF3( o0 += input3[0] * c3s; o1 += input3[1] * c3s; o2 += input3[2] * c3s; o3 += input3[3] * c3s; )
    stbIF4( o0 += input4[0] * c4s; o1 += input4[1] * c4s; o2 += input4[2] * c4s; o3 += input4[3] * c4s; )
    stbIF5( o0 += input5[0] * c5s; o1 += input5[1] * c5s; o2 += input5[2] * c5s; o3 += input5[3] * c5s; )
    stbIF6( o0 += input6[0] * c6s; o1 += input6[1] * c6s; o2 += input6[2] * c6s; o3 += input6[3] * c6s; )
    stbIF7( o0 += input7[0] * c7s; o1 += input7[1] * c7s; o2 += input7[2] * c7s; o3 += input7[3] * c7s; )
    output[0] = o0; output[1] = o1; output[2] = o2; output[3] = o3;
    output += 4;
    stbIF0( input0 += 4; ) stbIF1( input1 += 4; ) stbIF2( input2 += 4; ) stbIF3( input3 += 4; ) stbIF4( input4 += 4; ) stbIF5( input5 += 4; ) stbIF6( input6 += 4; ) stbIF7( input7 += 4; )
  }
  #endif
  STBIR_NO_UNROLL_LOOP_START
  while ( input0 < input0_end )
  {
    float o0;
    STBIR_NO_UNROLL(output);
    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( o0 = output[0] + input0[0] * c0s; )
    #else
    stbIF0( o0  = input0[0] * c0s; )
    #endif
    stbIF1( o0 += input1[0] * c1s; )
    stbIF2( o0 += input2[0] * c2s; )
    stbIF3( o0 += input3[0] * c3s; )
    stbIF4( o0 += input4[0] * c4s; )
    stbIF5( o0 += input5[0] * c5s; )
    stbIF6( o0 += input6[0] * c6s; )
    stbIF7( o0 += input7[0] * c7s; )
    output[0] = o0;
    ++output;
    stbIF0( ++input0; ) stbIF1( ++input1; ) stbIF2( ++input2; ) stbIF3( ++input3; ) stbIF4( ++input4; ) stbIF5( ++input5; ) stbIF6( ++input6; ) stbIF7( ++input7; )
  }
}